

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void usageMessage(ostream *stream,char *program_name,bool verbose)

{
  ostream *poVar1;
  char *pcVar2;
  byte in_DL;
  char *in_RSI;
  ostream *in_RDI;
  string compressionNames;
  allocator<char> local_59;
  string local_58 [8];
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  string local_38 [39];
  byte local_11;
  char *local_10;
  ostream *local_8;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  local_8 = in_RDI;
  poVar1 = std::operator<<(in_RDI,"Usage: ");
  poVar1 = std::operator<<(poVar1,local_10);
  poVar1 = std::operator<<(poVar1," [options] infile [infile2...] [-o outfile]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  if ((local_11 & 1) != 0) {
    std::__cxx11::string::string(local_38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    Imf_3_4::getCompressionNamesString(local_58,local_38);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator(&local_59);
    poVar1 = std::operator<<(local_8,
                             "Read an OpenEXR image from infile, write an identical copy to outfile reporting time taken to read/write and file sizes.\n\nOptions:\n\n  -o file                     file to write to. If no file specified, uses a memory buffer\n                              note: file may be overwritten multiple times during tests\n  -p n                        part number to copy, or \"all\" for all parts\n                              default is \"all\" \n\n  -m                          set to multi-threaded (system selected thread count)\n  -t n                        Use a pool of n worker threads for processing files.\n                              Default is single threaded (no thread pool)\n\n  -l level                    set DWA or ZIP compression level\n\n  -z,--compression list       list of compression methods to test\n                              ("
                            );
    pcVar2 = (char *)std::__cxx11::string::c_str();
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::operator<<(poVar1,
                    ",orig,all\n                              default orig: retains original method)\n  --convert                   shorthand options for writing a new file with no metrics:\n                              -p all --type orig --time none --type orig --no-size --passes 1\n                              change pixel type or compression by specifying --type or -z after --convert\n  --bench                     shorthand options for robust performance benchmarking:\n                              -p all --compression all --time write,reread --passes 10 --type half,float --no-size --csv\n\n  -16 rgba|all                [DEPRECATED] force 16 bit half float: either just RGBA, or all channels\n                              Use --type half or --type mixed instead\n --pixelmode list             list of pixel types to use (float,half,mixed,orig)\n                              mixed uses half for RGBA, float for others. Default is \'orig\'\n --time list                  comma separated list of operations to report timing for.\n                              operations can be any of read,write,reread (use --time none for no timing)\n --no-size                    don\'t output size data\n --json                       print output as JSON dictionary (Default mode)\n --csv                        print output in csv mode. If passes>1, show median timing\n                              default is JSON mode\n --passes num                 write and re-read file num times (default 1)\n\n  -h, --help                  print this message\n  -v                          output progress messages\n\n  --version                   print version information\n\n"
                   );
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void
usageMessage (ostream& stream, const char* program_name, bool verbose = false)
{
    stream << "Usage: " << program_name
           << " [options] infile [infile2...] [-o outfile]" << endl;

    if (verbose)
    {
        std::string compressionNames;
        getCompressionNamesString ("/", compressionNames);
        stream
            << "Read an OpenEXR image from infile, write an identical copy to outfile"
               " reporting time taken to read/write and file sizes.\n"
               "\n"
               "Options:\n"
               "\n"
               "  -o file                     file to write to. If no file specified, uses a memory buffer\n"
               "                              note: file may be overwritten multiple times during tests\n"
               "  -p n                        part number to copy, or \"all\" for all parts\n"
               "                              default is \"all\" \n"
               "\n"
               "  -m                          set to multi-threaded (system selected thread count)\n"
               "  -t n                        Use a pool of n worker threads for processing files.\n"
               "                              Default is single threaded (no thread pool)\n"
               "\n"
               "  -l level                    set DWA or ZIP compression level\n"
               "\n"
               "  -z,--compression list       list of compression methods to test\n"
               "                              ("
            << compressionNames.c_str ()
            << ",orig,all\n"
               "                              default orig: retains original method)\n"

               "  --convert                   shorthand options for writing a new file with no metrics:\n"
               "                              -p all --type orig --time none --type orig --no-size --passes 1\n"
               "                              change pixel type or compression by specifying --type or -z after --convert\n"
               "  --bench                     shorthand options for robust performance benchmarking:\n"
               "                              -p all --compression all --time write,reread --passes 10 --type half,float --no-size --csv\n"
               "\n"
               "  -16 rgba|all                [DEPRECATED] force 16 bit half float: either just RGBA, or all channels\n"
               "                              Use --type half or --type mixed instead\n"
               " --pixelmode list             list of pixel types to use (float,half,mixed,orig)\n"
               "                              mixed uses half for RGBA, float for others. Default is 'orig'\n"
               " --time list                  comma separated list of operations to report timing for.\n"
               "                              operations can be any of read,write,reread (use --time none for no timing)\n"
               " --no-size                    don't output size data\n"
               " --json                       print output as JSON dictionary (Default mode)\n"
               " --csv                        print output in csv mode. If passes>1, show median timing\n"
               "                              default is JSON mode\n"
               " --passes num                 write and re-read file num times (default 1)\n"
               "\n"
               "  -h, --help                  print this message\n"
               "  -v                          output progress messages\n"
               "\n"
               "  --version                   print version information\n"
               "\n";
    }
}